

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMFData.cpp
# Opt level: O0

void __thiscall
pele::physics::PMF::PmfData::read_pmf(PmfData *this,string *fname,int a_doAverage,int param_4)

{
  ulong uVar1;
  byte bVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  istream *piVar7;
  ostream *os_;
  Arena *pAVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 in_EDX;
  string *in_RSI;
  char cVar9;
  long in_RDI;
  uint j;
  istringstream sinput;
  uint i_1;
  int i;
  istringstream iss;
  string memfile;
  ifstream infile;
  int line_count;
  int variable_count;
  unsigned_long pos2;
  unsigned_long pos1;
  string remaininglines;
  string secondline;
  string firstline;
  string *in_stack_fffffffffffff638;
  Print *in_stack_fffffffffffff640;
  char *in_stack_fffffffffffff650;
  size_type in_stack_fffffffffffff658;
  string *in_stack_fffffffffffff660;
  ostream *in_stack_fffffffffffff668;
  undefined7 in_stack_fffffffffffff670;
  undefined1 in_stack_fffffffffffff677;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff680;
  char *in_stack_fffffffffffff688;
  Print *this_01;
  uint local_934;
  istringstream local_930 [296];
  ifstream *in_stack_fffffffffffff7f8;
  uint local_7ac;
  string local_498 [36];
  int local_474;
  long local_470 [48];
  string local_2f0 [32];
  string local_2d0 [48];
  undefined1 local_2a0 [520];
  int local_98;
  int local_94;
  ulong local_90;
  Print *local_88;
  string local_80 [32];
  string local_60 [32];
  string local_40 [36];
  undefined4 local_1c;
  string *local_18;
  char *local_8;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  std::__cxx11::string::string(local_80);
  std::ifstream::ifstream(local_2a0,local_18,_S_in);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    std::operator+(in_stack_fffffffffffff688,in_stack_fffffffffffff680);
    amrex::Abort(in_stack_fffffffffffff638);
    std::__cxx11::string::~string(local_2d0);
  }
  read_pmf_file_abi_cxx11_(in_stack_fffffffffffff7f8);
  std::ifstream::close();
  std::__cxx11::istringstream::istringstream((istringstream *)local_470,local_2f0,_S_in);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_470,local_40);
  bVar3 = checkQuotes(in_stack_fffffffffffff660);
  if (!bVar3) {
    local_8 = "PMF file variable quotes unbalanced";
    amrex::Abort_host(in_stack_fffffffffffff650);
  }
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_470,local_60);
  local_88 = (Print *)0x0;
  local_90 = 0;
  local_94 = 0;
  while( true ) {
    this_01 = local_88;
    lVar6 = std::__cxx11::string::length();
    uVar1 = local_90;
    bVar3 = false;
    if (this_01 < (Print *)(lVar6 - 1U)) {
      lVar6 = std::__cxx11::string::length();
      bVar3 = uVar1 < lVar6 - 1U;
    }
    if (!bVar3) break;
    local_88 = (Print *)std::__cxx11::string::find((char)local_40,0x22);
    local_90 = std::__cxx11::string::find((char)local_40,0x22);
    local_94 = local_94 + 1;
    local_88 = (Print *)(local_90 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
  local_88 = (Print *)0x0;
  local_90 = 0;
  for (local_474 = 0; local_474 < local_94; local_474 = local_474 + 1) {
    cVar9 = (char)local_40;
    local_88 = (Print *)std::__cxx11::string::find(cVar9,0x22);
    local_90 = std::__cxx11::string::find(cVar9,0x22);
    std::__cxx11::string::substr((ulong)local_498,(ulong)local_40);
    this_00 = amrex::
              Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffff640,(size_type)in_stack_fffffffffffff638);
    std::__cxx11::string::operator=((string *)this_00,local_498);
    std::__cxx11::string::~string(local_498);
    local_88 = (Print *)(local_90 + 1);
  }
  amrex::OutStream();
  amrex::Print::Print((Print *)CONCAT17(in_stack_fffffffffffff677,in_stack_fffffffffffff670),
                      in_stack_fffffffffffff668);
  amrex::Print::operator<<(in_stack_fffffffffffff640,(int *)in_stack_fffffffffffff638);
  amrex::Print::operator<<(in_stack_fffffffffffff640,(char (*) [29])in_stack_fffffffffffff638);
  amrex::Print::operator<<
            (in_stack_fffffffffffff640,
             (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
              *)in_stack_fffffffffffff638);
  amrex::Print::~Print(this_01);
  local_98 = 0;
  while( true ) {
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_470,local_80);
    uVar4 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    if (!(bool)uVar4) break;
    local_98 = local_98 + 1;
  }
  os_ = amrex::OutStream();
  amrex::Print::Print((Print *)CONCAT17(uVar4,in_stack_fffffffffffff670),os_);
  amrex::Print::operator<<(in_stack_fffffffffffff640,(int *)in_stack_fffffffffffff638);
  amrex::Print::operator<<(in_stack_fffffffffffff640,(char (*) [30])in_stack_fffffffffffff638);
  amrex::Print::operator<<
            (in_stack_fffffffffffff640,
             (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
              *)in_stack_fffffffffffff638);
  amrex::Print::~Print(this_01);
  *(int *)(in_RDI + 0x20) = local_98;
  *(int *)(in_RDI + 0x24) = local_94 + -1;
  *(undefined4 *)(in_RDI + 0x28) = local_1c;
  pAVar8 = amrex::The_Pinned_Arena();
  iVar5 = (*pAVar8->_vptr_Arena[2])(pAVar8,(long)local_98 << 3);
  *(ulong *)(in_RDI + 0x30) = CONCAT44(extraout_var,iVar5);
  pAVar8 = amrex::The_Pinned_Arena();
  iVar5 = (*pAVar8->_vptr_Arena[2])(pAVar8,(long)(local_98 * (local_94 + -1)) << 3);
  *(ulong *)(in_RDI + 0x38) = CONCAT44(extraout_var_00,iVar5);
  *(undefined1 *)(in_RDI + 0x49) = 1;
  std::ios::clear((int)local_470 + (int)*(undefined8 *)(local_470[0] + -0x18));
  std::istream::seekg((long)local_470,_S_beg);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_470,local_40);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_470,local_60);
  for (local_7ac = 0; local_7ac < *(uint *)(in_RDI + 0x20); local_7ac = local_7ac + 1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_470,local_80);
    std::__cxx11::istringstream::istringstream(local_930,local_80,_S_in);
    std::istream::operator>>(local_930,(double *)(*(long *)(in_RDI + 0x30) + (ulong)local_7ac * 8));
    for (local_934 = 0; local_934 < *(uint *)(in_RDI + 0x24); local_934 = local_934 + 1) {
      std::istream::operator>>
                (local_930,
                 (double *)
                 (*(long *)(in_RDI + 0x38) +
                 (ulong)(local_934 * *(int *)(in_RDI + 0x20) + local_7ac) * 8));
    }
    std::__cxx11::istringstream::~istringstream(local_930);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_470);
  std::__cxx11::string::~string(local_2f0);
  std::ifstream::~ifstream(local_2a0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void
PmfData::read_pmf(const std::string& fname, int a_doAverage, int /*a_verbose*/)
{
  std::string firstline, secondline, remaininglines;
  unsigned long pos1, pos2;
  int variable_count, line_count;

  std::ifstream infile(fname);
  if (!infile.is_open()) {
    amrex::Abort("Unable to open pmf input file " + fname);
  }
  const std::string memfile = read_pmf_file(infile);
  infile.close();
  std::istringstream iss(memfile);

  std::getline(iss, firstline);
  if (!checkQuotes(firstline)) {
    amrex::Abort("PMF file variable quotes unbalanced");
  }
  std::getline(iss, secondline);
  pos1 = 0;
  pos2 = 0;
  variable_count = 0;
  while ((pos1 < firstline.length() - 1) && (pos2 < firstline.length() - 1)) {
    pos1 = firstline.find('"', pos1);
    pos2 = firstline.find('"', pos1 + 1);
    variable_count++;
    pos1 = pos2 + 1;
  }

  pmf_names.resize(variable_count);
  pos1 = 0;
  pos2 = 0;
  for (int i = 0; i < variable_count; i++) {
    pos1 = firstline.find('"', pos1);
    pos2 = firstline.find('"', pos1 + 1);
    pmf_names[i] = firstline.substr(pos1 + 1, pos2 - (pos1 + 1));
    pos1 = pos2 + 1;
  }

  // Check variable names

  amrex::Print() << variable_count << " variables found in PMF file"
                 << std::endl;
  // for (int i = 0; i < variable_count; i++)
  //  amrex::Print() << "Variable found: " << PMF::pmf_names[i] <<
  //  std::endl;

  line_count = 0;
  while (std::getline(iss, remaininglines)) {
    line_count++;
  }
  amrex::Print() << line_count << " data lines found in PMF file" << std::endl;

  m_data_h.m_nPoint = line_count;
  m_data_h.m_nVar = variable_count - 1;
  m_data_h.m_doAverage = a_doAverage;
  m_data_h.pmf_X = (amrex::Real*)amrex::The_Pinned_Arena()->alloc(
    line_count * sizeof(amrex::Real));
  m_data_h.pmf_Y = (amrex::Real*)amrex::The_Pinned_Arena()->alloc(
    line_count * (variable_count - 1) * sizeof(amrex::Real));
  m_host_allocated = true;

  iss.clear();
  iss.seekg(0, std::ios::beg);
  std::getline(iss, firstline);
  std::getline(iss, secondline);
  for (unsigned int i = 0; i < m_data_h.m_nPoint; i++) {
    std::getline(iss, remaininglines);
    std::istringstream sinput(remaininglines);
    sinput >> m_data_h.pmf_X[i];
    for (unsigned int j = 0; j < m_data_h.m_nVar; j++) {
      sinput >> m_data_h.pmf_Y[j * m_data_h.m_nPoint + i];
    }
  }
}